

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void anon_unknown.dwarf_39a3::Test_TemplateDictionary_AddSectionDictionary::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  bool bVar16;
  int iVar17;
  TemplateDictionary *pTVar18;
  char *pcVar19;
  char *expected;
  string dump;
  TemplateDictionary local_b50 [32];
  TemplateDictionary local_b30 [32];
  TemplateDictionary local_b10 [32];
  TemplateDictionary local_af0 [32];
  TemplateDictionary local_ad0 [32];
  TemplateString local_ab0;
  TemplateString local_a90;
  TemplateDictionaryPeer local_a70;
  TemplateString local_a68;
  TemplateString local_a48;
  TemplateDictionaryPeer local_a28;
  TemplateString local_a20;
  TemplateString local_a00;
  TemplateDictionaryPeer local_9e0;
  TemplateString local_9d8;
  TemplateString local_9b8;
  TemplateDictionaryPeer local_998;
  TemplateString local_990;
  TemplateString local_970;
  TemplateDictionaryPeer local_950;
  TemplateString local_948;
  TemplateString local_928;
  TemplateString local_908;
  undefined1 local_8e8 [8];
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  dummy;
  TemplateString local_8b0;
  TemplateString local_890;
  TemplateString local_870;
  TemplateString local_850;
  TemplateString local_830;
  TemplateString local_810;
  TemplateString local_7f0;
  TemplateString local_7d0;
  TemplateString local_7b0;
  TemplateString local_790;
  TemplateString local_770;
  TemplateString local_750;
  TemplateString local_730;
  TemplateString local_710;
  TemplateString local_6f0;
  TemplateString local_6d0;
  TemplateString local_6b0;
  TemplateString local_690;
  TemplateString local_670;
  TemplateString local_650;
  TemplateString local_630;
  TemplateString local_610;
  TemplateString local_5f0;
  TemplateString local_5d0;
  TemplateString local_5b0;
  TemplateString local_590;
  TemplateString local_570;
  TemplateString local_550;
  TemplateString local_530;
  TemplateString local_510;
  TemplateString local_4f0;
  TemplateString local_4d0;
  TemplateString local_4b0;
  TemplateString local_490;
  TemplateString local_470;
  TemplateString local_450;
  TemplateString local_430;
  TemplateString local_410;
  TemplateString local_3f0;
  TemplateString local_3d0;
  TemplateString local_3b0;
  TemplateString local_390;
  TemplateString local_370;
  TemplateString local_350;
  TemplateString local_330;
  TemplateString local_310;
  TemplateString local_2f0;
  TemplateString local_2d0;
  TemplateDictionaryPeer local_2b0;
  TemplateDictionaryPeer subdict_2_1_peer;
  size_t sStack_2a0;
  undefined8 local_298;
  TemplateId TStack_290;
  TemplateDictionary *subdict_2_1;
  size_t sStack_278;
  bool local_270;
  undefined7 uStack_26f;
  TemplateId TStack_268;
  TemplateString local_260;
  TemplateDictionaryPeer local_240;
  TemplateDictionaryPeer subdict_2_peer;
  size_t sStack_230;
  undefined8 local_228;
  TemplateId TStack_220;
  TemplateDictionary *subdict_2;
  size_t sStack_208;
  bool local_200;
  undefined7 uStack_1ff;
  TemplateId TStack_1f8;
  TemplateString local_1f0;
  TemplateString local_1d0;
  TemplateString local_1b0;
  TemplateDictionaryPeer local_190;
  TemplateDictionaryPeer subdict_1b_peer;
  TemplateDictionaryPeer subdict_1a_peer;
  size_t sStack_178;
  undefined8 local_170;
  TemplateId TStack_168;
  TemplateDictionary *subdict_1b;
  size_t sStack_150;
  bool local_148;
  undefined7 uStack_147;
  TemplateId TStack_140;
  TemplateDictionary *local_138;
  TemplateDictionary *subdict_1a;
  size_t sStack_128;
  bool local_120;
  undefined7 uStack_11f;
  TemplateId TStack_118;
  TemplateString local_110;
  TemplateString local_f0;
  TemplateString local_d0;
  TemplateDictionaryPeer local_a0;
  TemplateDictionaryPeer peer;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString
            ((TemplateString *)&peer,(StaticTemplateString *)(anonymous_namespace)::kSectName);
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_78,(TemplateString *)&peer,(UnsafeArena *)0x0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_a0,local_78);
  ctemplate::TemplateString::TemplateString(&local_d0,"TOPLEVEL");
  ctemplate::TemplateString::TemplateString(&local_f0,"foo");
  TVar1.length_ = local_d0.length_;
  TVar1.ptr_ = local_d0.ptr_;
  TVar1.is_immutable_ = local_d0.is_immutable_;
  TVar1._17_7_ = local_d0._17_7_;
  TVar1.id_ = local_d0.id_;
  TVar11.length_ = local_f0.length_;
  TVar11.ptr_ = local_f0.ptr_;
  TVar11.is_immutable_ = local_f0.is_immutable_;
  TVar11._17_7_ = local_f0._17_7_;
  TVar11.id_ = local_f0.id_;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar11);
  ctemplate::TemplateString::TemplateString(&local_110,"TOPLEVEL2");
  ctemplate::TemplateString::TemplateString((TemplateString *)&subdict_1a,"foo2");
  TVar2.length_ = local_110.length_;
  TVar2.ptr_ = local_110.ptr_;
  TVar2.is_immutable_ = local_110.is_immutable_;
  TVar2._17_7_ = local_110._17_7_;
  TVar2.id_ = local_110.id_;
  TVar12.length_ = sStack_128;
  TVar12.ptr_ = (char *)subdict_1a;
  TVar12.is_immutable_ = local_120;
  TVar12._17_7_ = uStack_11f;
  TVar12.id_ = TStack_118;
  ctemplate::TemplateDictionary::SetValue(TVar2,TVar12);
  ctemplate::TemplateString::TemplateString((TemplateString *)&subdict_1b,"section1");
  TVar3.length_ = sStack_150;
  TVar3.ptr_ = (char *)subdict_1b;
  TVar3.is_immutable_ = local_148;
  TVar3._17_7_ = uStack_147;
  TVar3.id_ = TStack_140;
  local_138 = (TemplateDictionary *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar3);
  ctemplate::TemplateString::TemplateString
            ((TemplateString *)&subdict_1a_peer,"section1__ignored__",8);
  TVar4.length_ = sStack_178;
  TVar4.ptr_ = (char *)subdict_1a_peer.dict_;
  TVar4._16_8_ = local_170;
  TVar4.id_ = TStack_168;
  pTVar18 = (TemplateDictionary *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar4);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&subdict_1b_peer,local_138);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_190,pTVar18);
  ctemplate::TemplateString::TemplateString(&local_1b0,"SUBLEVEL");
  ctemplate::TemplateString::TemplateString(&local_1d0,"subfoo");
  TVar5.length_ = local_1b0.length_;
  TVar5.ptr_ = local_1b0.ptr_;
  TVar5.is_immutable_ = local_1b0.is_immutable_;
  TVar5._17_7_ = local_1b0._17_7_;
  TVar5.id_ = local_1b0.id_;
  TVar13.length_ = local_1d0.length_;
  TVar13.ptr_ = local_1d0.ptr_;
  TVar13.is_immutable_ = local_1d0.is_immutable_;
  TVar13._17_7_ = local_1d0._17_7_;
  TVar13.id_ = local_1d0.id_;
  ctemplate::TemplateDictionary::SetValue(TVar5,TVar13);
  ctemplate::TemplateString::TemplateString(&local_1f0,"SUBLEVEL");
  ctemplate::TemplateString::TemplateString((TemplateString *)&subdict_2,"subbar");
  TVar6.length_ = local_1f0.length_;
  TVar6.ptr_ = local_1f0.ptr_;
  TVar6.is_immutable_ = local_1f0.is_immutable_;
  TVar6._17_7_ = local_1f0._17_7_;
  TVar6.id_ = local_1f0.id_;
  TVar14.length_ = sStack_208;
  TVar14.ptr_ = (char *)subdict_2;
  TVar14.is_immutable_ = local_200;
  TVar14._17_7_ = uStack_1ff;
  TVar14.id_ = TStack_1f8;
  ctemplate::TemplateDictionary::SetValue(TVar6,TVar14);
  ctemplate::TemplateString::TemplateString((TemplateString *)&subdict_2_peer,"section2");
  TVar7.length_ = sStack_230;
  TVar7.ptr_ = (char *)subdict_2_peer.dict_;
  TVar7._16_8_ = local_228;
  TVar7.id_ = TStack_220;
  pTVar18 = (TemplateDictionary *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar7);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_240,pTVar18);
  ctemplate::TemplateString::TemplateString(&local_260,"TOPLEVEL");
  ctemplate::TemplateString::TemplateString((TemplateString *)&subdict_2_1,"bar");
  TVar8.length_ = local_260.length_;
  TVar8.ptr_ = local_260.ptr_;
  TVar8.is_immutable_ = local_260.is_immutable_;
  TVar8._17_7_ = local_260._17_7_;
  TVar8.id_ = local_260.id_;
  TVar15.length_ = sStack_278;
  TVar15.ptr_ = (char *)subdict_2_1;
  TVar15.is_immutable_ = local_270;
  TVar15._17_7_ = uStack_26f;
  TVar15.id_ = TStack_268;
  ctemplate::TemplateDictionary::SetValue(TVar8,TVar15);
  ctemplate::TemplateString::TemplateString((TemplateString *)&subdict_2_1_peer,"sub");
  TVar9.length_ = sStack_2a0;
  TVar9.ptr_ = (char *)subdict_2_1_peer.dict_;
  TVar9._16_8_ = local_298;
  TVar9.id_ = TStack_290;
  pTVar18 = (TemplateDictionary *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar9);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_2b0,pTVar18);
  ctemplate::TemplateString::TemplateString(&local_2d0,"GLOBAL");
  TVar10.length_ = local_2d0.length_;
  TVar10.ptr_ = local_2d0.ptr_;
  TVar10.is_immutable_ = local_2d0.is_immutable_;
  TVar10._17_7_ = local_2d0._17_7_;
  TVar10.id_ = local_2d0.id_;
  ctemplate::TemplateDictionary::SetIntValue(TVar10,(long)pTVar18);
  ctemplate::TemplateString::TemplateString(&local_2f0,"GLOBAL");
  ctemplate::TemplateString::TemplateString(&local_310,"top");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_2f0,&local_310);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"GLOBAL\", \"top\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_330,"TOPLEVEL");
  ctemplate::TemplateString::TemplateString(&local_350,"foo");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_330,&local_350);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"TOPLEVEL\", \"foo\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_370,"TOPLEVEL2");
  ctemplate::TemplateString::TemplateString(&local_390,"foo2");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_370,&local_390);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"TOPLEVEL2\", \"foo2\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_3b0,"SUBLEVEL");
  ctemplate::TemplateString::TemplateString(&local_3d0,"");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_3b0,&local_3d0);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"SUBLEVEL\", \"\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_3f0,"GLOBAL");
  ctemplate::TemplateString::TemplateString(&local_410,"top");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&subdict_1b_peer,&local_3f0,&local_410);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_1a_peer.ValueIs(\"GLOBAL\", \"top\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_430,"TOPLEVEL");
  ctemplate::TemplateString::TemplateString(&local_450,"foo");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&subdict_1b_peer,&local_430,&local_450);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_1a_peer.ValueIs(\"TOPLEVEL\", \"foo\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_470,"TOPLEVEL2");
  ctemplate::TemplateString::TemplateString(&local_490,"foo2");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&subdict_1b_peer,&local_470,&local_490);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_1a_peer.ValueIs(\"TOPLEVEL2\", \"foo2\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_4b0,"SUBLEVEL");
  ctemplate::TemplateString::TemplateString(&local_4d0,"subfoo");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&subdict_1b_peer,&local_4b0,&local_4d0);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_1a_peer.ValueIs(\"SUBLEVEL\", \"subfoo\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_4f0,"GLOBAL");
  ctemplate::TemplateString::TemplateString(&local_510,"top");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_190,&local_4f0,&local_510);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_1b_peer.ValueIs(\"GLOBAL\", \"top\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_530,"TOPLEVEL");
  ctemplate::TemplateString::TemplateString(&local_550,"foo");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_190,&local_530,&local_550);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_1b_peer.ValueIs(\"TOPLEVEL\", \"foo\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_570,"TOPLEVEL2");
  ctemplate::TemplateString::TemplateString(&local_590,"foo2");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_190,&local_570,&local_590);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_1b_peer.ValueIs(\"TOPLEVEL2\", \"foo2\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_5b0,"SUBLEVEL");
  ctemplate::TemplateString::TemplateString(&local_5d0,"subbar");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_190,&local_5b0,&local_5d0);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_1b_peer.ValueIs(\"SUBLEVEL\", \"subbar\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_5f0,"GLOBAL");
  ctemplate::TemplateString::TemplateString(&local_610,"top");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_240,&local_5f0,&local_610);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_2_peer.ValueIs(\"GLOBAL\", \"top\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_630,"TOPLEVEL");
  ctemplate::TemplateString::TemplateString(&local_650,"bar");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_240,&local_630,&local_650);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_2_peer.ValueIs(\"TOPLEVEL\", \"bar\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_670,"TOPLEVEL2");
  ctemplate::TemplateString::TemplateString(&local_690,"foo2");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_240,&local_670,&local_690);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_2_peer.ValueIs(\"TOPLEVEL2\", \"foo2\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_6b0,"SUBLEVEL");
  ctemplate::TemplateString::TemplateString(&local_6d0,"");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_240,&local_6b0,&local_6d0);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_2_peer.ValueIs(\"SUBLEVEL\", \"\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_6f0,"GLOBAL");
  ctemplate::TemplateString::TemplateString(&local_710,"21");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_2b0,&local_6f0,&local_710);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_2_1_peer.ValueIs(\"GLOBAL\", \"21\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_730,"TOPLEVEL");
  ctemplate::TemplateString::TemplateString(&local_750,"bar");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_2b0,&local_730,&local_750);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_2_1_peer.ValueIs(\"TOPLEVEL\", \"bar\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_770,"TOPLEVEL2");
  ctemplate::TemplateString::TemplateString(&local_790,"foo2");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_2b0,&local_770,&local_790);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_2_1_peer.ValueIs(\"TOPLEVEL2\", \"foo2\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_7b0,"SUBLEVEL");
  ctemplate::TemplateString::TemplateString(&local_7d0,"");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_2b0,&local_7b0,&local_7d0);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_2_1_peer.ValueIs(\"SUBLEVEL\", \"\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_7f0,"section1");
  bVar16 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&local_a0,&local_7f0);
  if (bVar16) {
    fprintf(_stderr,"Check failed: %s\n","!(peer.IsHiddenSection(\"section1\"))");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_810,"section2");
  bVar16 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&local_a0,&local_810);
  if (bVar16) {
    fprintf(_stderr,"Check failed: %s\n","!(peer.IsHiddenSection(\"section2\"))");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_830,"section3");
  bVar16 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&local_a0,&local_830);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.IsHiddenSection(\"section3\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_850,"sub");
  bVar16 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&local_a0,&local_850);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.IsHiddenSection(\"sub\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_870,"section1");
  bVar16 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&subdict_1b_peer,&local_870);
  if (bVar16) {
    fprintf(_stderr,"Check failed: %s\n","!(subdict_1a_peer.IsHiddenSection(\"section1\"))");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_890,"sub");
  bVar16 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&subdict_1b_peer,&local_890);
  if (((bVar16 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_1a_peer.IsHiddenSection(\"sub\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_8b0,"sub");
  bVar16 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&local_240,&local_8b0);
  if (bVar16) {
    fprintf(_stderr,"Check failed: %s\n","!(subdict_2_peer.IsHiddenSection(\"sub\"))");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString
            ((TemplateString *)
             &dummy.
              super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"sub");
  bVar16 = ctemplate::TemplateDictionaryPeer::IsHiddenSection
                     (&local_2b0,
                      (TemplateString *)
                      &dummy.
                       super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar16) {
    fprintf(_stderr,"Check failed: %s\n","!(subdict_2_1_peer.IsHiddenSection(\"sub\"))");
    exit(1);
  }
  std::
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ::vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            *)local_8e8);
  ctemplate::TemplateString::TemplateString(&local_908,"section1");
  iVar17 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries
                     (&local_a0,&local_908,
                      (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       *)local_8e8);
  if (iVar17 != 2) {
    fprintf(_stderr,"Check failed: %s %s %s\n","2","==",
            "peer.GetSectionDictionaries(\"section1\", &dummy)");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_928,"section2");
  iVar17 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries
                     (&local_a0,&local_928,
                      (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       *)local_8e8);
  if (iVar17 != 1) {
    fprintf(_stderr,"Check failed: %s %s %s\n","1","==",
            "peer.GetSectionDictionaries(\"section2\", &dummy)");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_948,"sub");
  iVar17 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries
                     (&local_240,&local_948,
                      (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       *)local_8e8);
  if (iVar17 != 1) {
    fprintf(_stderr,"Check failed: %s %s %s\n","1","==",
            "subdict_2_peer.GetSectionDictionaries(\"sub\", &dummy)");
    exit(1);
  }
  pTVar18 = GetSectionDict(local_78,"section1",0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_950,pTVar18);
  ctemplate::TemplateString::TemplateString(&local_970,"SUBLEVEL");
  ctemplate::TemplateString::TemplateString(&local_990,"subfoo");
  bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_950,&local_970,&local_990);
  if (((bVar16 ^ 0xffU) & 1) == 0) {
    pTVar18 = GetSectionDict(local_78,"section1",1);
    ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_998,pTVar18);
    ctemplate::TemplateString::TemplateString(&local_9b8,"SUBLEVEL");
    ctemplate::TemplateString::TemplateString(&local_9d8,"subbar");
    bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_998,&local_9b8,&local_9d8);
    if (((bVar16 ^ 0xffU) & 1) != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "TemplateDictionaryPeer(GetSectionDict(&dict, \"section1\", 1)) .ValueIs(\"SUBLEVEL\", \"subbar\")"
             );
      exit(1);
    }
    pTVar18 = GetSectionDict(local_78,"section2",0);
    ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_9e0,pTVar18);
    ctemplate::TemplateString::TemplateString(&local_a00,"TOPLEVEL");
    ctemplate::TemplateString::TemplateString(&local_a20,"bar");
    bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_9e0,&local_a00,&local_a20);
    if (((bVar16 ^ 0xffU) & 1) != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "TemplateDictionaryPeer(GetSectionDict(&dict, \"section2\", 0)) .ValueIs(\"TOPLEVEL\", \"bar\")"
             );
      exit(1);
    }
    pTVar18 = GetSectionDict(local_78,"section2",0);
    pTVar18 = GetSectionDict(pTVar18,"sub",0);
    ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_a28,pTVar18);
    ctemplate::TemplateString::TemplateString(&local_a48,"TOPLEVEL");
    ctemplate::TemplateString::TemplateString(&local_a68,"bar");
    bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a28,&local_a48,&local_a68);
    if (((bVar16 ^ 0xffU) & 1) != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "TemplateDictionaryPeer( GetSectionDict(GetSectionDict(&dict, \"section2\", 0), \"sub\", 0)) .ValueIs(\"TOPLEVEL\", \"bar\")"
             );
      exit(1);
    }
    pTVar18 = GetSectionDict(local_78,"section2",0);
    pTVar18 = GetSectionDict(pTVar18,"sub",0);
    ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_a70,pTVar18);
    ctemplate::TemplateString::TemplateString(&local_a90,"GLOBAL");
    ctemplate::TemplateString::TemplateString(&local_ab0,"21");
    bVar16 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a70,&local_a90,&local_ab0);
    if (((bVar16 ^ 0xffU) & 1) != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "TemplateDictionaryPeer( GetSectionDict(GetSectionDict(&dict, \"section2\", 0), \"sub\", 0)) .ValueIs(\"GLOBAL\", \"21\")"
             );
      exit(1);
    }
    ctemplate::TemplateDictionary::name_abi_cxx11_(local_ad0);
    pcVar19 = (char *)std::__cxx11::string::c_str();
    iVar17 = strcmp(pcVar19,"test_SetAddSectionDictionary");
    std::__cxx11::string::~string((string *)local_ad0);
    if (iVar17 != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(dict.name().c_str(), \"test_SetAddSectionDictionary\") == 0");
      exit(1);
    }
    ctemplate::TemplateDictionary::name_abi_cxx11_(local_af0);
    pcVar19 = (char *)std::__cxx11::string::c_str();
    iVar17 = strcmp(pcVar19,"test_SetAddSectionDictionary/section1#1");
    std::__cxx11::string::~string((string *)local_af0);
    if (iVar17 != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(subdict_1a->name().c_str(), \"test_SetAddSectionDictionary/section1#1\") == 0"
             );
      exit(1);
    }
    ctemplate::TemplateDictionary::name_abi_cxx11_(local_b10);
    pcVar19 = (char *)std::__cxx11::string::c_str();
    iVar17 = strcmp(pcVar19,"test_SetAddSectionDictionary/section1#2");
    std::__cxx11::string::~string((string *)local_b10);
    if (iVar17 != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(subdict_1b->name().c_str(), \"test_SetAddSectionDictionary/section1#2\") == 0"
             );
      exit(1);
    }
    ctemplate::TemplateDictionary::name_abi_cxx11_(local_b30);
    pcVar19 = (char *)std::__cxx11::string::c_str();
    iVar17 = strcmp(pcVar19,"test_SetAddSectionDictionary/section2#1");
    std::__cxx11::string::~string((string *)local_b30);
    if (iVar17 == 0) {
      ctemplate::TemplateDictionary::name_abi_cxx11_(local_b50);
      pcVar19 = (char *)std::__cxx11::string::c_str();
      iVar17 = strcmp(pcVar19,"test_SetAddSectionDictionary/section2#1/sub#1");
      std::__cxx11::string::~string((string *)local_b50);
      if (iVar17 != 0) {
        fprintf(_stderr,"Check failed: %s\n",
                "strcmp(subdict_2_1->name().c_str(), \"test_SetAddSectionDictionary/section2#1/sub#1\") == 0"
               );
        exit(1);
      }
      std::__cxx11::string::string((string *)&expected);
      ctemplate::TemplateDictionary::DumpToString((string *)local_78,(int)(string *)&expected);
      pcVar19 = (char *)std::__cxx11::string::c_str();
      iVar17 = strcmp(pcVar19,
                      "global dictionary {\n   BI_NEWLINE: >\n<\n   BI_SPACE: > <\n   GLOBAL: >top<\n};\ndictionary \'test_SetAddSectionDictionary\' {\n   TOPLEVEL: >foo<\n   TOPLEVEL2: >foo2<\n   section section1 (dict 1 of 2) -->\n     dictionary \'test_SetAddSectionDictionary/section1#1\' {\n       SUBLEVEL: >subfoo<\n     }\n   section section1 (dict 2 of 2) -->\n     dictionary \'test_SetAddSectionDictionary/section1#2\' {\n       SUBLEVEL: >subbar<\n     }\n   section section2 (dict 1 of 1) -->\n     dictionary \'test_SetAddSectionDictionary/section2#1\' {\n       TOPLEVEL: >bar<\n       section sub (dict 1 of 1) -->\n         dictionary \'test_SetAddSectionDictionary/section2#1/sub#1\' {\n           GLOBAL: >21<\n         }\n     }\n}\n"
                     );
      if (iVar17 != 0) {
        fprintf(_stderr,"Check failed: %s\n","strcmp(dump.c_str(), expected) == 0");
        exit(1);
      }
      std::__cxx11::string::~string((string *)&expected);
      std::
      vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
      ::~vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                 *)local_8e8);
      ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
      return;
    }
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(subdict_2->name().c_str(), \"test_SetAddSectionDictionary/section2#1\") == 0");
    exit(1);
  }
  fprintf(_stderr,"Check failed: %s\n",
          "TemplateDictionaryPeer(GetSectionDict(&dict, \"section1\", 0)) .ValueIs(\"SUBLEVEL\", \"subfoo\")"
         );
  exit(1);
}

Assistant:

TEST(TemplateDictionary, AddSectionDictionary) {
  // For fun, we'll make this constructor take a static template string.
  TemplateDictionary dict(kSectName, NULL);
  TemplateDictionaryPeer peer(&dict);
  dict.SetValue("TOPLEVEL", "foo");
  dict.SetValue("TOPLEVEL2", "foo2");

  TemplateDictionary* subdict_1a = dict.AddSectionDictionary("section1");
  // This is the same dict, but name is specified a different way.
  TemplateDictionary* subdict_1b = dict.AddSectionDictionary(
      TemplateString("section1__ignored__", strlen("section1")));
  TemplateDictionaryPeer subdict_1a_peer(subdict_1a);
  TemplateDictionaryPeer subdict_1b_peer(subdict_1b);
  subdict_1a->SetValue("SUBLEVEL", "subfoo");
  subdict_1b->SetValue("SUBLEVEL", "subbar");

  TemplateDictionary* subdict_2 = dict.AddSectionDictionary("section2");
  TemplateDictionaryPeer subdict_2_peer(subdict_2);
  subdict_2->SetValue("TOPLEVEL", "bar");    // overriding top dict
  TemplateDictionary* subdict_2_1 = subdict_2->AddSectionDictionary("sub");
  TemplateDictionaryPeer subdict_2_1_peer(subdict_2_1);
  subdict_2_1->SetIntValue("GLOBAL", 21);    // overrides value in setUp()

  // Verify that all variables that should be look-up-able are, and that
  // we have proper precedence.
  EXPECT_TRUE(peer.ValueIs("GLOBAL", "top"));
  EXPECT_TRUE(peer.ValueIs("TOPLEVEL", "foo"));
  EXPECT_TRUE(peer.ValueIs("TOPLEVEL2", "foo2"));
  EXPECT_TRUE(peer.ValueIs("SUBLEVEL", ""));

  EXPECT_TRUE(subdict_1a_peer.ValueIs("GLOBAL", "top"));
  EXPECT_TRUE(subdict_1a_peer.ValueIs("TOPLEVEL", "foo"));
  EXPECT_TRUE(subdict_1a_peer.ValueIs("TOPLEVEL2", "foo2"));
  EXPECT_TRUE(subdict_1a_peer.ValueIs("SUBLEVEL", "subfoo"));

  EXPECT_TRUE(subdict_1b_peer.ValueIs("GLOBAL", "top"));
  EXPECT_TRUE(subdict_1b_peer.ValueIs("TOPLEVEL", "foo"));
  EXPECT_TRUE(subdict_1b_peer.ValueIs("TOPLEVEL2", "foo2"));
  EXPECT_TRUE(subdict_1b_peer.ValueIs("SUBLEVEL", "subbar"));

  EXPECT_TRUE(subdict_2_peer.ValueIs("GLOBAL", "top"));
  EXPECT_TRUE(subdict_2_peer.ValueIs("TOPLEVEL", "bar"));
  EXPECT_TRUE(subdict_2_peer.ValueIs("TOPLEVEL2", "foo2"));
  EXPECT_TRUE(subdict_2_peer.ValueIs("SUBLEVEL", ""));

  EXPECT_TRUE(subdict_2_1_peer.ValueIs("GLOBAL", "21"));
  EXPECT_TRUE(subdict_2_1_peer.ValueIs("TOPLEVEL", "bar"));
  EXPECT_TRUE(subdict_2_1_peer.ValueIs("TOPLEVEL2", "foo2"));
  EXPECT_TRUE(subdict_2_1_peer.ValueIs("SUBLEVEL", ""));

  // Verify that everyone knows about its sub-dictionaries, and also
  // that these go 'up the chain' on lookup failure
  EXPECT_FALSE(peer.IsHiddenSection("section1"));
  EXPECT_FALSE(peer.IsHiddenSection("section2"));
  EXPECT_TRUE(peer.IsHiddenSection("section3"));
  EXPECT_TRUE(peer.IsHiddenSection("sub"));
  EXPECT_FALSE(subdict_1a_peer.IsHiddenSection("section1"));
  EXPECT_TRUE(subdict_1a_peer.IsHiddenSection("sub"));
  EXPECT_FALSE(subdict_2_peer.IsHiddenSection("sub"));
  EXPECT_FALSE(subdict_2_1_peer.IsHiddenSection("sub"));

  // We should get the dictionary-lengths right as well
  vector<const TemplateDictionary*> dummy;
  EXPECT_EQ(2, peer.GetSectionDictionaries("section1", &dummy));
  EXPECT_EQ(1, peer.GetSectionDictionaries("section2", &dummy));
  EXPECT_EQ(1, subdict_2_peer.GetSectionDictionaries("sub", &dummy));
  // Test some of the values
  EXPECT_TRUE(TemplateDictionaryPeer(GetSectionDict(&dict, "section1", 0))
              .ValueIs("SUBLEVEL", "subfoo"));
  EXPECT_TRUE(TemplateDictionaryPeer(GetSectionDict(&dict, "section1", 1))
              .ValueIs("SUBLEVEL", "subbar"));
  EXPECT_TRUE(TemplateDictionaryPeer(GetSectionDict(&dict, "section2", 0))
              .ValueIs("TOPLEVEL", "bar"));
  EXPECT_TRUE(TemplateDictionaryPeer(
      GetSectionDict(GetSectionDict(&dict, "section2", 0), "sub", 0))
              .ValueIs("TOPLEVEL", "bar"));
  EXPECT_TRUE(TemplateDictionaryPeer(
      GetSectionDict(GetSectionDict(&dict, "section2", 0), "sub", 0))
              .ValueIs("GLOBAL", "21"));

  // Make sure we're making descriptive names
  EXPECT_STREQ(dict.name().c_str(),
               "test_SetAddSectionDictionary");
  EXPECT_STREQ(subdict_1a->name().c_str(),
               "test_SetAddSectionDictionary/section1#1");
  EXPECT_STREQ(subdict_1b->name().c_str(),
               "test_SetAddSectionDictionary/section1#2");
  EXPECT_STREQ(subdict_2->name().c_str(),
               "test_SetAddSectionDictionary/section2#1");
  EXPECT_STREQ(subdict_2_1->name().c_str(),
               "test_SetAddSectionDictionary/section2#1/sub#1");

  // Finally, we can test the whole kit and kaboodle
  string dump;
  dict.DumpToString(&dump);
  const char* const expected =
    ("global dictionary {\n"
     "   BI_NEWLINE: >\n"
     "<\n"
     "   BI_SPACE: > <\n"
     "   GLOBAL: >top<\n"
     "};\n"
     "dictionary 'test_SetAddSectionDictionary' {\n"
     "   TOPLEVEL: >foo<\n"
     "   TOPLEVEL2: >foo2<\n"
     "   section section1 (dict 1 of 2) -->\n"
     "     dictionary 'test_SetAddSectionDictionary/section1#1' {\n"
     "       SUBLEVEL: >subfoo<\n"
     "     }\n"
     "   section section1 (dict 2 of 2) -->\n"
     "     dictionary 'test_SetAddSectionDictionary/section1#2' {\n"
     "       SUBLEVEL: >subbar<\n"
     "     }\n"
     "   section section2 (dict 1 of 1) -->\n"
     "     dictionary 'test_SetAddSectionDictionary/section2#1' {\n"
     "       TOPLEVEL: >bar<\n"
     "       section sub (dict 1 of 1) -->\n"
     "         dictionary 'test_SetAddSectionDictionary/section2#1/sub#1' {\n"
     "           GLOBAL: >21<\n"
     "         }\n"
     "     }\n"
     "}\n");
  EXPECT_STREQ(dump.c_str(), expected);
}